

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O2

void helper_mtc0_mvpcontrol_mips64el(CPUMIPSState_conflict5 *env,target_ulong arg1)

{
  uint uVar1;
  
  uVar1 = env->mvp->CP0_MVPControl;
  env->mvp->CP0_MVPControl =
       ((uint)arg1 ^ uVar1) & ((env->CP0_VPEConf0 << 0x1e) >> 0x1f & 0xbU) + (uVar1 & 2) * 2 ^ uVar1
  ;
  return;
}

Assistant:

void helper_mtc0_mvpcontrol(CPUMIPSState *env, target_ulong arg1)
{
    uint32_t mask = 0;
    uint32_t newval;

    if (env->CP0_VPEConf0 & (1 << CP0VPEC0_MVP)) {
        mask |= (1 << CP0MVPCo_CPA) | (1 << CP0MVPCo_VPC) |
                (1 << CP0MVPCo_EVP);
    }
    if (env->mvp->CP0_MVPControl & (1 << CP0MVPCo_VPC)) {
        mask |= (1 << CP0MVPCo_STLB);
    }
    newval = (env->mvp->CP0_MVPControl & ~mask) | (arg1 & mask);

    /* TODO: Enable/disable shared TLB, enable/disable VPEs. */

    env->mvp->CP0_MVPControl = newval;
}